

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O0

int sprintf_s(char *buffer,size_t sizeOfBuffer,char *format,...)

{
  char in_AL;
  int *piVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_48;
  undefined4 local_44;
  va_list ap;
  int retval;
  char *format_local;
  size_t sizeOfBuffer_local;
  char *buffer_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  if ((buffer == (char *)0x0) || (format == (char *)0x0)) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    buffer_local._4_4_ = -1;
  }
  else {
    ap[0].overflow_arg_area = local_f8;
    ap[0]._0_8_ = &stack0x00000008;
    local_44 = 0x30;
    local_48 = 0x18;
    ap[0].reg_save_area._4_4_ = vsnprintf(buffer,sizeOfBuffer,format,&local_48);
    if ((ap[0].reg_save_area._4_4_ < 0) || (sizeOfBuffer <= (ulong)(long)ap[0].reg_save_area._4_4_))
    {
      ap[0].reg_save_area._4_4_ = -1;
    }
    buffer_local._4_4_ = ap[0].reg_save_area._4_4_;
  }
  return buffer_local._4_4_;
}

Assistant:

int sprintf_s( char *buffer, size_t sizeOfBuffer, const char *format, ... )
{
    int retval;
    va_list ap;

	if( buffer == nullptr || format == nullptr)
	{
		errno = EINVAL;
		return -1;
	}

    va_start(ap, format);
    retval = vsnprintf(buffer, sizeOfBuffer, format, ap);
    va_end(ap);

	if( retval < 0 || static_cast<size_t>(retval) >= sizeOfBuffer )
		retval = -1;

    return retval;
}